

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

void doWriteRead(pixels *p,string *filename,string *cppfilename,bool tiled,int xs,int ys,
                exr_compression_t comp,char *pattern)

{
  Channel *pCVar1;
  Slice *pSVar2;
  void *pvVar3;
  uint uVar4;
  string *psVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  ostream *poVar10;
  long *plVar11;
  char *pcVar12;
  ulong uVar13;
  exr_compression_t *peVar14;
  undefined4 *puVar15;
  uint uVar16;
  undefined7 in_register_00000009;
  exr_context_initializer_t *func;
  int *piVar17;
  pixels *ppVar18;
  int32_t *func_00;
  char *pcVar19;
  int iVar20;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  char cVar21;
  char *pcVar22;
  string *filename_00;
  long lVar23;
  long lVar24;
  exr_context_t p_Var25;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar26;
  float fVar27;
  float fVar28;
  bool bVar29;
  int in_stack_fffffffffffffa78;
  int partidx;
  exr_context_t f;
  undefined8 local_568;
  uint local_55c;
  pixels *local_558;
  int32_t tilew;
  int local_54c;
  string *local_548;
  ulong local_540;
  char *local_538;
  int32_t tileh;
  int32_t tlevy;
  undefined4 local_524;
  long local_520;
  uint local_518;
  int local_514;
  string *local_510;
  char *local_508;
  ulong local_500;
  int local_4f8;
  int local_4f4;
  int local_4f0;
  int zlev;
  int32_t local_4e8;
  int32_t pixelstride;
  exr_context_t local_4e0;
  exr_attr_box2i_t dataW;
  pixels cpprestore;
  pixels cpploadc;
  exr_context_initializer_t cinit;
  pixels cpploadcpp;
  pixels restore;
  
  pcVar12 = (char *)CONCAT44(in_register_0000008c,ys);
  local_568 = CONCAT44(in_register_00000084,xs);
  local_518 = (uint)CONCAT71(in_register_00000009,tiled);
  lVar23 = (long)p->_w * (long)xs;
  pcVar22 = (char *)((long)p->_h * (long)ys);
  uVar16 = xs * 0x11;
  local_500 = (ulong)uVar16;
  uVar4 = ys * 0x1d;
  cinit.error_handler_fn = (exr_error_handler_cb_t)0x0;
  cinit.max_tile_width = 0;
  cinit.max_tile_height = 0;
  cinit.destroy_fn = (exr_destroy_stream_func_ptr_t)0x0;
  cinit.max_image_width = 0;
  cinit.max_image_height = 0;
  cinit.size_fn = (exr_query_size_func_ptr_t)0x0;
  cinit.write_fn = (exr_write_func_ptr_t)0x0;
  cinit.user_data = (void *)0x0;
  cinit.read_fn = (exr_read_func_ptr_t)0x0;
  cinit.alloc_fn = (exr_memory_allocation_func_t)0x0;
  cinit.free_fn = (exr_memory_free_func_t)0x0;
  cinit.flags = 0;
  cinit._100_4_ = 0;
  cinit.size = 0x68;
  cinit.zip_level = -2;
  cinit.dwa_quality = -1.0;
  local_558 = p;
  local_548 = cppfilename;
  local_538 = pcVar22;
  local_520 = lVar23;
  local_510 = filename;
  exr_set_default_zip_compression_level(0xffffffff);
  cinit.zip_level = 3;
  cinit._96_8_ = cinit._96_8_ | 8;
  dataW.max.field_0.field_0.x = (int)lVar23 + uVar16 + -1;
  dataW.max.field_0.field_0.y = (int)pcVar22 + -1 + uVar4;
  local_540 = (ulong)uVar4;
  dataW.min.field_0.field_0.x = uVar16;
  dataW.min.field_0.field_0.y = uVar4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  if (pattern == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x19b5a0);
  }
  else {
    sVar9 = strlen(pattern);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pattern,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," tiled: ",8);
  pcVar22 = "no";
  cVar21 = (char)local_518;
  if (cVar21 != '\0') {
    pcVar22 = "yes";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar22,(ulong)(local_518 & 0xff) | 2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," sampling ",10);
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_568);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,ys);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," comp ",6);
  plVar11 = (long *)std::ostream::operator<<(poVar10,comp);
  std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
  std::ostream::put((char)plVar11);
  std::ostream::flush();
  func = &cinit;
  iVar7 = exr_start_write(&f,(local_510->_M_dataplus)._M_p,0);
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
    pcVar12 = (char *)exr_get_default_error_message(iVar7);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    core_test_fail("exr_start_write ( &f, filename.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit)",
                   (char *)0x505,0x17cb41,(char *)func);
  }
  if (cVar21 == '\0') {
    piVar17 = &partidx;
    iVar7 = exr_add_part(f,"scan",0);
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
      pcVar12 = (char *)exr_get_default_error_message(iVar7);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
      }
      else {
        sVar9 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      core_test_fail("exr_add_part (f, \"scan\", EXR_STORAGE_SCANLINE, &partidx)",(char *)0x50e,
                     0x17cb41,(char *)piVar17);
    }
  }
  else {
    piVar17 = &partidx;
    iVar7 = exr_add_part(f,"tiled",1);
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
      pcVar12 = (char *)exr_get_default_error_message(iVar7);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
      }
      else {
        sVar9 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      core_test_fail("exr_add_part (f, \"tiled\", EXR_STORAGE_TILED, &partidx)",(char *)0x509,
                     0x17cb41,(char *)piVar17);
    }
  }
  pcVar22 = local_538;
  iVar7 = exr_initialize_required_attr_simple(f,partidx,local_520,local_538,comp);
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
    pcVar12 = (char *)exr_get_default_error_message(iVar7);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    core_test_fail("exr_initialize_required_attr_simple (f, partidx, fw, fh, comp)",(char *)0x512,
                   0x17cb41,pcVar22);
  }
  iVar7 = exr_set_data_window(f,partidx,&dataW);
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
    pcVar12 = (char *)exr_get_default_error_message(iVar7);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    core_test_fail("exr_set_data_window (f, partidx, &dataW)",(char *)0x513,0x17cb41,pcVar22);
  }
  iVar7 = exr_get_zip_compression_level(f,partidx,&zlev);
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
    pcVar12 = (char *)exr_get_default_error_message(iVar7);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    core_test_fail("exr_get_zip_compression_level (f, partidx, &zlev)",(char *)0x516,0x17cb41,
                   pcVar22);
  }
  if (zlev != 3) {
    core_test_fail("zlev == 3",(char *)0x517,0x17cb41,pcVar22);
  }
  iVar7 = exr_set_zip_compression_level(f,partidx,4);
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
    pcVar12 = (char *)exr_get_default_error_message(iVar7);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    core_test_fail("exr_set_zip_compression_level (f, partidx, 4)",(char *)0x518,0x17cb41,pcVar22);
  }
  if (cVar21 != '\0') {
    pcVar22 = (char *)0x20;
    iVar7 = exr_set_tile_descriptor(f,partidx,0x20,0x20,0,1);
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
      pcVar12 = (char *)exr_get_default_error_message(iVar7);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
      }
      else {
        sVar9 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      core_test_fail("exr_set_tile_descriptor ( f, partidx, 32, 32, EXR_TILE_ONE_LEVEL, EXR_TILE_ROUND_UP)"
                     ,(char *)0x51c,0x17cb41,pcVar22);
    }
  }
  pcVar22 = (char *)0x0;
  iVar7 = exr_add_channel(f,partidx,"I",0,0,local_568,pcVar12);
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
    pcVar12 = (char *)exr_get_default_error_message(iVar7);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    core_test_fail("exr_add_channel ( f, partidx, \"I\", EXR_PIXEL_UINT, EXR_PERCEPTUALLY_LOGARITHMIC, xs, ys)"
                   ,(char *)0x520,0x17cb41,pcVar22);
  }
  lVar23 = 0;
  do {
    pcVar22 = (char *)0x1;
    iVar7 = exr_add_channel(f,partidx,*(undefined8 *)((long)channels + lVar23),1,0,local_568,pcVar12
                           );
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
      pcVar12 = (char *)exr_get_default_error_message(iVar7);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
      }
      else {
        sVar9 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      core_test_fail("exr_add_channel ( f, partidx, channels[c], EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, xs, ys)"
                     ,(char *)0x52b,0x17cb41,pcVar22);
    }
    lVar23 = lVar23 + 8;
  } while (lVar23 != 0x28);
  ppVar18 = (pixels *)0x2;
  iVar7 = exr_add_channel(f,partidx,"F",2,0,local_568,pcVar12);
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
    pcVar12 = (char *)exr_get_default_error_message(iVar7);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    core_test_fail("exr_add_channel ( f, partidx, \"F\", EXR_PIXEL_FLOAT, EXR_PERCEPTUALLY_LOGARITHMIC, xs, ys)"
                   ,(char *)0x534,0x17cb41,(char *)ppVar18);
  }
  iVar7 = exr_write_header(f);
  p_Var25 = f;
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
    pcVar12 = (char *)exr_get_default_error_message(iVar7);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    core_test_fail("exr_write_header (f)",(char *)0x536,0x17cb41,(char *)ppVar18);
  }
  local_4e0 = f;
  if (cVar21 == '\0') {
    cpploadcpp._0_8_ = cpploadcpp._0_8_ & 0xffffffff00000000;
    iVar7 = exr_get_scanlines_per_chunk(f,0);
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
      pcVar12 = (char *)exr_get_default_error_message(iVar7);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
      }
      else {
        sVar9 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      core_test_fail("exr_get_scanlines_per_chunk (f, 0, &scansperchunk)",(char *)0x2ef,0x17d24a,
                     (char *)ppVar18);
    }
    local_54c = ys * 0xbc;
    if ((int)local_540 < local_54c) {
      local_55c = (uint)CONCAT71((uint7)(uint3)((uint)local_54c >> 8),1);
      uVar13 = local_540 & 0xffffffff;
      do {
        ppVar18 = &cpprestore;
        iVar7 = exr_write_scanline_chunk_info(p_Var25,0,uVar13);
        if (iVar7 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
          pcVar12 = (char *)exr_get_default_error_message(iVar7);
          if (pcVar12 == (char *)0x0) {
            std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
          }
          else {
            sVar9 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          core_test_fail("exr_write_scanline_chunk_info (f, 0, y, &cinfo)",(char *)0x2f4,0x17d24a,
                         (char *)ppVar18);
        }
        if ((local_55c & 1) == 0) {
          ppVar18 = &restore;
          iVar7 = exr_encoding_update(p_Var25,0,&cpprestore);
          if (iVar7 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
            pcVar12 = (char *)exr_get_default_error_message(iVar7);
            if (pcVar12 == (char *)0x0) {
              std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
            }
            else {
              sVar9 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            core_test_fail("exr_encoding_update (f, 0, &cinfo, &encoder)",(char *)0x2fc,0x17d24a,
                           (char *)ppVar18);
          }
        }
        else {
          ppVar18 = &restore;
          iVar7 = exr_encoding_initialize(p_Var25,0,&cpprestore);
          if (iVar7 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
            pcVar12 = (char *)exr_get_default_error_message(iVar7);
            if (pcVar12 == (char *)0x0) {
              std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
            }
            else {
              sVar9 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            core_test_fail("exr_encoding_initialize (f, 0, &cinfo, &encoder)",(char *)0x2f8,0x17d24a
                           ,(char *)ppVar18);
          }
        }
        iVar7 = (int)uVar13 - (int)local_540;
        if (0 < (short)restore._stride_x) {
          iVar8 = local_558->_stride_x;
          lVar24 = 0;
          lVar23 = 0;
          do {
            uVar6 = restore._0_8_;
            if (*(int *)(restore._0_8_ + 8 + lVar24) == 0) {
              *(undefined8 *)(restore._0_8_ + 0x28 + lVar24) = 0;
              *(undefined4 *)(restore._0_8_ + 0x20 + lVar24) = 0;
              ppVar18 = (pixels *)0x0;
            }
            else {
              fill_pointers(local_558,(exr_coding_channel_info_t *)(lVar24 + restore._0_8_),
                            (iVar7 / ys) * iVar8,(void **)&cpploadc,&tlevy,&tilew);
              if (tlevy != *(short *)(uVar6 + 0x1c + lVar24)) {
                core_test_fail("curchan.user_bytes_per_element == pixelstride",(char *)0x314,
                               0x17d24a,(char *)(ulong)(uint)tlevy);
              }
              *(ulong *)(restore._0_8_ + 0x28 + lVar24) = CONCAT44(cpploadc._h,cpploadc._w);
              *(int32_t *)(restore._0_8_ + 0x20 + lVar24) = tlevy;
              ppVar18 = (pixels *)(ulong)(uint)tilew;
            }
            *(int *)(restore._0_8_ + 0x24 + lVar24) = (int)ppVar18;
            lVar23 = lVar23 + 1;
            lVar24 = lVar24 + 0x30;
          } while (lVar23 < (short)restore._stride_x);
        }
        p_Var25 = local_4e0;
        if ((local_55c & 1) != 0) {
          iVar7 = exr_encoding_choose_default_routines(local_4e0,0,&restore);
          if (iVar7 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
            pcVar12 = (char *)exr_get_default_error_message(iVar7);
            if (pcVar12 == (char *)0x0) {
              std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
            }
            else {
              sVar9 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            core_test_fail("exr_encoding_choose_default_routines (f, 0, &encoder)",(char *)0x31e,
                           0x17d24a,(char *)ppVar18);
          }
        }
        iVar7 = exr_encoding_run(p_Var25,0,&restore);
        if (iVar7 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
          pcVar12 = (char *)exr_get_default_error_message(iVar7);
          if (pcVar12 == (char *)0x0) {
            std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
          }
          else {
            sVar9 = strlen(pcVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          core_test_fail("exr_encoding_run (f, 0, &encoder)",(char *)0x320,0x17d24a,(char *)ppVar18)
          ;
        }
        uVar16 = (int)uVar13 + cpploadcpp._w;
        uVar13 = (ulong)uVar16;
        local_55c = 0;
      } while ((int)uVar16 < local_54c);
    }
    iVar7 = exr_encoding_destroy(p_Var25,&restore);
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
      pcVar12 = (char *)exr_get_default_error_message(iVar7);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
      }
      else {
        sVar9 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      core_test_fail("exr_encoding_destroy (f, &encoder)",(char *)0x324,0x17d24a,(char *)ppVar18);
    }
  }
  else {
    if (((int)local_568 != 1) || (ys != 1)) {
      core_test_fail("xs == 1 && ys == 1",(char *)0x335,0x17cf90,(char *)ppVar18);
    }
    func_00 = &tlevy;
    iVar7 = exr_get_tile_levels(f,0,&cpploadcpp);
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
      pcVar12 = (char *)exr_get_default_error_message(iVar7);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
      }
      else {
        sVar9 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, &tlevx, &tlevy)",(char *)0x336,0x17cf90,
                     (char *)func_00);
    }
    if ((cpploadcpp._w != 1) || (tlevy != 1)) {
      core_test_fail("tlevx == 1 && tlevy == 1",(char *)0x337,0x17cf90,(char *)func_00);
    }
    pcVar22 = (char *)0x0;
    iVar7 = exr_get_tile_sizes(p_Var25,0,0,0,&tilew,&tileh);
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
      pcVar12 = (char *)exr_get_default_error_message(iVar7);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
      }
      else {
        sVar9 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &tilew, &tileh)",(char *)0x339,0x17cf90,
                     pcVar22);
    }
    if ((tilew != 0x20) || (tileh != 0x20)) {
      core_test_fail("tilew == 32 && tileh == 32",(char *)0x33a,0x17cf90,pcVar22);
    }
    local_4f8 = 0xbc;
    ppVar18 = (pixels *)0xbc;
    if ((int)local_540 < 0xbc) {
      local_514 = (int)local_568 * 0x56c;
      local_55c = (uint)CONCAT71((uint7)(uint3)((uint)local_514 >> 8),1);
      local_508 = (char *)0x0;
      ppVar18 = (pixels *)(local_540 & 0xffffffff);
      do {
        local_4f4 = (int)ppVar18;
        if ((int)local_500 < local_514) {
          uVar13 = local_500;
          iVar7 = 0;
          do {
            local_54c = iVar7;
            ppVar18 = &restore;
            local_4f0 = (int)uVar13;
            pcVar22 = local_508;
            iVar7 = exr_write_tile_chunk_info(p_Var25,0,local_54c,local_508,0,0,&cpprestore);
            if (iVar7 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Return Error: (",0xf);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
              pcVar12 = (char *)exr_get_default_error_message(iVar7);
              if (pcVar12 == (char *)0x0) {
                std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
              }
              else {
                sVar9 = strlen(pcVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              core_test_fail("exr_write_tile_chunk_info (f, 0, tilex, tiley, 0, 0, &cinfo)",
                             (char *)0x348,0x17cf90,pcVar22);
            }
            if ((local_55c & 1) == 0) {
              iVar7 = exr_encoding_update(p_Var25,0,&cpprestore);
              if (iVar7 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Return Error: (",0xf);
                poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
                pcVar12 = (char *)exr_get_default_error_message(iVar7);
                if (pcVar12 == (char *)0x0) {
                  std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
                }
                else {
                  sVar9 = strlen(pcVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
                }
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                core_test_fail("exr_encoding_update (f, 0, &cinfo, &encoder)",(char *)0x351,0x17cf90
                               ,(char *)ppVar18);
              }
            }
            else {
              iVar7 = exr_encoding_initialize(p_Var25,0,&cpprestore);
              if (iVar7 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Return Error: (",0xf);
                poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
                pcVar12 = (char *)exr_get_default_error_message(iVar7);
                if (pcVar12 == (char *)0x0) {
                  std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
                }
                else {
                  sVar9 = strlen(pcVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
                }
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                core_test_fail("exr_encoding_initialize (f, 0, &cinfo, &encoder)",(char *)0x34c,
                               0x17cf90,(char *)ppVar18);
              }
            }
            if (0 < (short)restore._stride_x) {
              iVar8 = tileh * (int)local_508;
              iVar7 = local_558->_stride_x;
              iVar20 = tilew * local_54c;
              lVar24 = 0;
              lVar23 = 0;
              do {
                uVar6 = restore._0_8_;
                fill_pointers(local_558,(exr_coding_channel_info_t *)(restore._0_8_ + lVar24),
                              iVar20 + iVar8 * iVar7,(void **)&cpploadc,&pixelstride,&local_4e8);
                uVar16 = (uint)*(short *)(uVar6 + 0x1c + lVar24);
                if (pixelstride != uVar16) {
                  core_test_fail("curchan.user_bytes_per_element == pixelstride",(char *)0x361,
                                 0x17cf90,(char *)(ulong)uVar16);
                }
                *(ulong *)(restore._0_8_ + 0x28 + lVar24) = CONCAT44(cpploadc._h,cpploadc._w);
                *(int32_t *)(restore._0_8_ + 0x20 + lVar24) = pixelstride;
                *(int32_t *)(restore._0_8_ + 0x24 + lVar24) = local_4e8;
                lVar23 = lVar23 + 1;
                lVar24 = lVar24 + 0x30;
                ppVar18 = (pixels *)restore._0_8_;
              } while (lVar23 < (short)restore._stride_x);
            }
            p_Var25 = local_4e0;
            if ((local_55c & 1) != 0) {
              iVar7 = exr_encoding_choose_default_routines(local_4e0,0,&restore);
              if (iVar7 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Return Error: (",0xf);
                poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
                pcVar12 = (char *)exr_get_default_error_message(iVar7);
                if (pcVar12 == (char *)0x0) {
                  std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
                }
                else {
                  sVar9 = strlen(pcVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
                }
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                core_test_fail("exr_encoding_choose_default_routines (f, 0, &encoder)",(char *)0x36b
                               ,0x17cf90,(char *)ppVar18);
              }
            }
            iVar7 = exr_encoding_run(p_Var25,0,&restore);
            if (iVar7 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Return Error: (",0xf);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
              pcVar12 = (char *)exr_get_default_error_message(iVar7);
              if (pcVar12 == (char *)0x0) {
                std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
              }
              else {
                sVar9 = strlen(pcVar12);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
              }
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              core_test_fail("exr_encoding_run (f, 0, &encoder)",(char *)0x36d,0x17cf90,
                             (char *)ppVar18);
            }
            uVar13 = (ulong)(uint)(local_4f0 + tilew);
            local_55c = 0;
            iVar7 = local_54c + 1;
          } while (local_4f0 + tilew < local_514);
        }
        ppVar18 = (pixels *)(ulong)(uint)(local_4f4 + tileh);
        local_508 = (char *)(ulong)((int)local_508 + 1);
      } while (local_4f4 + tileh < local_4f8);
    }
    iVar7 = exr_encoding_destroy(p_Var25,&restore);
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
      pcVar12 = (char *)exr_get_default_error_message(iVar7);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
      }
      else {
        sVar9 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      core_test_fail("exr_encoding_destroy (f, &encoder)",(char *)0x371,0x17cf90,(char *)ppVar18);
    }
  }
  iVar7 = exr_finish();
  if (iVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
    pcVar12 = (char *)exr_get_default_error_message(iVar7);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    core_test_fail("exr_finish (&f)",(char *)0x53b,0x17cb41,(char *)ppVar18);
  }
  cpprestore._stride_x = (int)local_520 + -1;
  cpprestore._12_4_ = (int)local_538 + -1;
  cpprestore._w = 0;
  cpprestore._h = 0;
  iVar7 = (int)local_500;
  cpploadc._stride_x = (int)local_520 + -1 + iVar7;
  cpploadc._h = (int)local_540;
  cpploadc._12_4_ = (int)local_538 + -1 + cpploadc._h;
  cpploadcpp._w = 0;
  cpploadcpp._h = 0;
  cpploadc._w = iVar7;
  Imf_3_2::Header::Header
            ((Header *)&restore,(Box *)&cpprestore,(Box *)&cpploadc,1.0,(Vec2 *)&cpploadcpp,1.0,
             INCREASING_Y,ZIP_COMPRESSION);
  peVar14 = (exr_compression_t *)Imf_3_2::Header::compression();
  pcVar22 = (char *)(ulong)comp;
  *peVar14 = comp;
  puVar15 = (undefined4 *)Imf_3_2::Header::zipCompressionLevel();
  *puVar15 = 3;
  iVar8 = Imf_3_2::Header::zipCompressionLevel();
  if (iVar8 != 3) {
    core_test_fail("((const Header&) hdr).zipCompressionLevel () == 3",(char *)0x424,0x17d2e1,
                   pcVar22);
  }
  pcVar22 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&cpprestore,UINT,(int)local_568,ys,false);
  Imf_3_2::ChannelList::insert(pcVar22,(Channel *)0x183370);
  lVar23 = 0;
  do {
    pcVar22 = (char *)Imf_3_2::Header::channels();
    pCVar1 = *(Channel **)((long)channels + lVar23);
    Imf_3_2::Channel::Channel((Channel *)&cpprestore,HALF,(int)local_568,ys,false);
    Imf_3_2::ChannelList::insert(pcVar22,pCVar1);
    lVar23 = lVar23 + 8;
  } while (lVar23 != 0x28);
  pcVar22 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&cpprestore,FLOAT,(int)local_568,ys,false);
  Imf_3_2::ChannelList::insert(pcVar22,(Channel *)0x1833ca);
  lVar23 = local_520;
  pcVar22 = local_538;
  cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&cpploadc._stride_x;
  cpploadc._stride_x = 0;
  cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cpploadc.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_524 = (undefined4)local_540;
  bVar29 = SUB41(ys,0);
  tlevy = iVar7;
  cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  Imf_3_2::Slice::Make
            ((PixelType)&cpprestore,(void *)0x0,
             (Vec2 *)(local_558->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,(long)&tlevy,local_520,
             (ulong)local_538,0,local_558->_stride_x << 2,(int)local_568,0.0,bVar29,false);
  Imf_3_2::FrameBuffer::insert((char *)&cpploadc,(Slice *)0x183370);
  Imf_3_2::Slice::Make
            ((PixelType)&cpprestore,(void *)0x1,
             (Vec2 *)(local_558->h).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start,(long)&tlevy,lVar23,(ulong)pcVar22,0,
             local_558->_stride_x * 2,(int)local_568,0.0,bVar29,false);
  Imf_3_2::FrameBuffer::insert((char *)&cpploadc,(Slice *)0x17bbbd);
  Imf_3_2::Slice::Make
            ((PixelType)&cpprestore,(void *)0x2,
             (Vec2 *)(local_558->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,(long)&tlevy,lVar23,(ulong)pcVar22,0,
             local_558->_stride_x << 2,(int)local_568,0.0,bVar29,false);
  Imf_3_2::FrameBuffer::insert((char *)&cpploadc,(Slice *)0x1833ca);
  pvVar26 = local_558->rgba;
  lVar23 = 0;
  do {
    pSVar2 = *(Slice **)((long)channels + lVar23);
    Imf_3_2::Slice::Make
              ((PixelType)&cpprestore,(void *)0x1,
               (Vec2 *)(pvVar26->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       )._M_impl.super__Vector_impl_data._M_start,(long)&tlevy,local_520,
               (ulong)local_538,0,local_558->_stride_x * 2,(int)local_568,0.0,bVar29,false);
    Imf_3_2::FrameBuffer::insert((char *)&cpploadc,pSVar2);
    lVar23 = lVar23 + 8;
    pvVar26 = pvVar26 + 1;
  } while (lVar23 != 0x20);
  cVar21 = (char)local_518;
  if (cVar21 == '\0') {
    pcVar22 = (local_548->_M_dataplus)._M_p;
    uVar16 = Imf_3_2::globalThreadCount();
    filename_00 = local_510;
    pcVar19 = (char *)(ulong)uVar16;
    Imf_3_2::OutputFile::OutputFile((OutputFile *)&cpprestore,pcVar22,(Header *)&restore,uVar16);
    Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&cpprestore);
    Imf_3_2::OutputFile::writePixels((int)&cpprestore);
    Imf_3_2::OutputFile::~OutputFile((OutputFile *)&cpprestore);
  }
  else {
    cpploadcpp._w = 0x20;
    cpploadcpp._h = 0x20;
    cpploadcpp._stride_x = 0;
    cpploadcpp._12_4_ = 0;
    Imf_3_2::Header::setTileDescription((TileDescription *)&restore);
    lVar23 = local_520;
    pcVar19 = local_538;
    pcVar22 = (local_548->_M_dataplus)._M_p;
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledOutputFile::TiledOutputFile
              ((TiledOutputFile *)&cpprestore,pcVar22,(Header *)&restore,iVar7);
    Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&cpprestore);
    uVar13 = (ulong)cpploadcpp._0_8_ >> 0x20;
    fVar27 = ceilf((float)(int)lVar23 / (float)(cpploadcpp._0_8_ & 0xffffffff));
    fVar28 = ceilf((float)(int)pcVar19 / (float)uVar13);
    pcVar19 = (char *)0x0;
    Imf_3_2::TiledOutputFile::writeTiles
              ((int)&cpprestore,0,(int)(fVar27 + -1.0),0,(int)(fVar28 + -1.0));
    Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&cpprestore);
    filename_00 = local_510;
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&cpploadc);
  Imf_3_2::Header::~Header((Header *)&restore);
  pcVar22 = getenv("ENABLE_EXACT_FILE_COMPARE");
  psVar5 = local_548;
  if (pcVar22 != (char *)0x0) {
    iVar7 = compare_files((filename_00->_M_dataplus)._M_p,(local_548->_M_dataplus)._M_p);
    if (iVar7 != 0) {
      core_test_fail("compare_files",(char *)0x54c,0x17cb41,pcVar19);
    }
  }
  compare_files((filename_00->_M_dataplus)._M_p,(psVar5->_M_dataplus)._M_p);
  ppVar18 = local_558;
  pixels::pixels(&restore,local_558);
  pixels::pixels(&cpprestore,ppVar18);
  pixels::pixels(&cpploadc,ppVar18);
  pixels::pixels(&cpploadcpp,ppVar18);
  pixels::fillDead(&restore);
  pixels::fillDead(&cpprestore);
  pixels::fillDead(&cpploadc);
  pixels::fillDead(&cpploadcpp);
  iVar7 = exr_start_read(&f,(filename_00->_M_dataplus)._M_p,&cinit);
  if (iVar7 == 0) {
    pcVar22 = pcVar12;
    if (cVar21 == '\0') {
      doDecodeScan(f,&restore,(int)local_568,ys);
    }
    else {
      doDecodeTile(f,&restore,(int)local_568,ys);
    }
    iVar7 = exr_finish(&f);
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
      pcVar12 = (char *)exr_get_default_error_message(iVar7);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
      }
      else {
        sVar9 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      core_test_fail("exr_finish (&f)",(char *)0x562,0x17cb41,pcVar22);
    }
    iVar7 = exr_start_read(&f,(local_548->_M_dataplus)._M_p,&cinit);
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
      pcVar12 = (char *)exr_get_default_error_message(iVar7);
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
      }
      else {
        sVar9 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      core_test_fail("exr_start_read (&f, cppfilename.c_str (), &cinit)",(char *)0x564,0x17cb41,
                     pcVar22);
    }
    if (cVar21 == '\0') {
      doDecodeScan(f,&cpprestore,(int)local_568,ys);
    }
    else {
      doDecodeTile(f,&cpprestore,(int)local_568,ys);
    }
    iVar7 = exr_finish(&f);
    if (iVar7 == 0) {
      bVar29 = SUB81(local_520,0);
      iVar8 = (int)local_538;
      iVar7 = (int)local_500;
      iVar20 = (int)local_540;
      loadCPP(&cpploadcpp,local_548,bVar29,iVar8,iVar7,iVar20,in_stack_fffffffffffffa78);
      loadCPP(&cpploadc,filename_00,bVar29,iVar8,iVar7,iVar20,in_stack_fffffffffffffa78);
      if (comp - EXR_COMPRESSION_LAST_TYPE < 0xfffffffe) {
        pixels::compareExact(&cpploadcpp,&cpploadc,"C++ loaded C","C++ loaded C++");
        pixels::compareExact(&restore,&cpprestore,"C loaded C++","C loaded C");
        pixels::compareExact(&restore,&cpploadc,"C++ loaded C","C loaded C");
        pixels::compareExact(&restore,&cpploadcpp,"C++ loaded C++","C loaded C");
      }
      if (comp < EXR_COMPRESSION_PIZ) {
        pixels::compareExact(&restore,local_558,"orig","C loaded C");
      }
      else {
        pixels::compareClose(&restore,local_558,comp,"orig","C loaded C");
      }
      remove((filename_00->_M_dataplus)._M_p);
      remove((local_548->_M_dataplus)._M_p);
      lVar23 = 0xb0;
      do {
        pvVar3 = *(void **)((long)&cinit.flags + lVar23);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)cpploadcpp.rgba + lVar23 + -0x58) - (long)pvVar3);
        }
        lVar23 = lVar23 + -0x18;
      } while (lVar23 != 0x50);
      if (cpploadcpp.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(cpploadcpp.h.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)cpploadcpp.h.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)cpploadcpp.h.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (cpploadcpp.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(cpploadcpp.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)cpploadcpp.f.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)cpploadcpp.f.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (cpploadcpp.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(cpploadcpp.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)cpploadcpp.i.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)cpploadcpp.i.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      lVar23 = 0xb0;
      do {
        pvVar3 = *(void **)((long)&cpprestore.rgba[3].
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + lVar23);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)cpploadc.rgba + lVar23 + -0x58) - (long)pvVar3);
        }
        lVar23 = lVar23 + -0x18;
      } while (lVar23 != 0x50);
      if (cpploadc.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(cpploadc.h.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)cpploadc.h.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)cpploadc.h.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (cpploadc.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(cpploadc.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)cpploadc.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)cpploadc.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)cpploadc.i.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)cpploadc.i.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      lVar23 = 0xb0;
      do {
        pvVar3 = *(void **)((long)cpprestore.rgba + lVar23 + -0x68);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)cpprestore.rgba + lVar23 + -0x58) - (long)pvVar3);
        }
        lVar23 = lVar23 + -0x18;
      } while (lVar23 != 0x50);
      if (cpprestore.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(cpprestore.h.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)cpprestore.h.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)cpprestore.h.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (cpprestore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(cpprestore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)cpprestore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)cpprestore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (cpprestore.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(cpprestore.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)cpprestore.i.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)cpprestore.i.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      lVar23 = 0xb0;
      do {
        pvVar3 = *(void **)((long)&cpploadcpp.rgba[3].
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar23);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)restore.rgba + lVar23 + -0x58) - (long)pvVar3);
        }
        lVar23 = lVar23 + -0x18;
      } while (lVar23 != 0x50);
      if (restore.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(restore.h.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)restore.h.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)restore.h.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (restore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(restore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)restore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)restore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (restore.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(restore.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)restore.i.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)restore.i.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
    pcVar22 = (char *)exr_get_default_error_message(iVar7);
    if (pcVar22 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar22,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    core_test_fail("exr_finish (&f)",(char *)0x569,0x17cb41,pcVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
  pcVar12 = (char *)exr_get_default_error_message(iVar7);
  if (pcVar12 == (char *)0x0) {
    std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
  }
  else {
    sVar9 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar9);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  core_test_fail("exr_start_read (&f, filename.c_str (), &cinit)",(char *)0x55d,0x17cb41,pcVar19);
}

Assistant:

static void
doWriteRead (
    pixels&            p,
    const std::string& filename,
    const std::string& cppfilename,
    bool               tiled,
    int                xs,
    int                ys,
    exr_compression_t  comp,
    const char*        pattern)
{
    exr_context_t             f;
    int                       partidx;
    int                       fw    = p._w * xs;
    int                       fh    = p._h * ys;
    int                       dwx   = IMG_DATA_X * xs;
    int                       dwy   = IMG_DATA_Y * ys;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    exr_attr_box2i_t          dataW;

    exr_set_default_zip_compression_level (-1);
    cinit.zip_level = 3;
    cinit.flags |= EXR_CONTEXT_FLAG_WRITE_LEGACY_HEADER;

    dataW.min.x = dwx;
    dataW.min.y = dwy;
    dataW.max.x = dwx + fw - 1;
    dataW.max.y = dwy + fh - 1;

    std::cout << "  " << pattern << " tiled: " << (tiled ? "yes" : "no")
              << " sampling " << xs << ", " << ys << " comp " << (int) comp
              << std::endl;

    EXRCORE_TEST_RVAL (exr_start_write (
        &f, filename.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    if (tiled)
    {
        EXRCORE_TEST_RVAL (
            exr_add_part (f, "tiled", EXR_STORAGE_TILED, &partidx));
    }
    else
    {
        EXRCORE_TEST_RVAL (
            exr_add_part (f, "scan", EXR_STORAGE_SCANLINE, &partidx));
    }

    EXRCORE_TEST_RVAL (
        exr_initialize_required_attr_simple (f, partidx, fw, fh, comp));
    EXRCORE_TEST_RVAL (exr_set_data_window (f, partidx, &dataW));

    int zlev;
    EXRCORE_TEST_RVAL (exr_get_zip_compression_level (f, partidx, &zlev));
    EXRCORE_TEST (zlev == 3);
    EXRCORE_TEST_RVAL (exr_set_zip_compression_level (f, partidx, 4));
    if (tiled)
    {
        EXRCORE_TEST_RVAL (exr_set_tile_descriptor (
            f, partidx, 32, 32, EXR_TILE_ONE_LEVEL, EXR_TILE_ROUND_UP));
    }

    EXRCORE_TEST_RVAL (exr_add_channel (
        f, partidx, "I", EXR_PIXEL_UINT, EXR_PERCEPTUALLY_LOGARITHMIC, xs, ys));

    for (int c = 0; c < 5; ++c)
    {
        EXRCORE_TEST_RVAL (exr_add_channel (
            f,
            partidx,
            channels[c],
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            xs,
            ys));
    }
    EXRCORE_TEST_RVAL (exr_add_channel (
        f,
        partidx,
        "F",
        EXR_PIXEL_FLOAT,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        xs,
        ys));

    EXRCORE_TEST_RVAL (exr_write_header (f));
    if (tiled)
        doEncodeTile (f, p, xs, ys);
    else
        doEncodeScan (f, p, xs, ys);
    EXRCORE_TEST_RVAL (exr_finish (&f));

    try
    {
        saveCPP (p, cppfilename, tiled, xs, ys, comp, fw, fh, dwx, dwy);
    }
    catch (std::exception& e)
    {
        std::cerr << "ERROR saving " << cppfilename << ": " << e.what ()
                  << std::endl;
        EXRCORE_TEST_FAIL (saveCPP);
    }

#ifdef __linux
    if (getenv ("ENABLE_EXACT_FILE_COMPARE") &&
        0 != compare_files (filename.c_str(), cppfilename.c_str()))
    {
        EXRCORE_TEST_FAIL (compare_files);
    }
    else
    {
        compare_files (filename.c_str(), cppfilename.c_str());
    }
#endif
    pixels restore    = p;
    pixels cpprestore = p;
    pixels cpploadc   = p;
    pixels cpploadcpp = p;

    restore.fillDead ();
    cpprestore.fillDead ();
    cpploadc.fillDead ();
    cpploadcpp.fillDead ();

    EXRCORE_TEST_RVAL (exr_start_read (&f, filename.c_str (), &cinit));
    if (tiled)
        doDecodeTile (f, restore, xs, ys);
    else
        doDecodeScan (f, restore, xs, ys);
    EXRCORE_TEST_RVAL (exr_finish (&f));

    EXRCORE_TEST_RVAL (exr_start_read (&f, cppfilename.c_str (), &cinit));
    if (tiled)
        doDecodeTile (f, cpprestore, xs, ys);
    else
        doDecodeScan (f, cpprestore, xs, ys);
    EXRCORE_TEST_RVAL (exr_finish (&f));

    try
    {
        loadCPP (cpploadcpp, cppfilename, tiled, fw, fh, dwx, dwy);
    }
    catch (std::exception& e)
    {
        std::cerr << "ERROR loading " << cppfilename << ": " << e.what ()
                  << std::endl;
        EXRCORE_TEST_FAIL (loadCPP);
    }

    try
    {
        loadCPP (cpploadc, filename, tiled, fw, fh, dwx, dwy);
    }
    catch (std::exception& e)
    {
        std::cerr << "ERROR loading " << filename << ": " << e.what ()
                  << std::endl;
        EXRCORE_TEST_FAIL (loadCPP);
    }

    /* DWAA / DWAB seems to have some small number of ULP differences between C & C++ */
    if (comp != EXR_COMPRESSION_DWAA && comp != EXR_COMPRESSION_DWAB)
    {
        cpploadcpp.compareExact (cpploadc, "C++ loaded C", "C++ loaded C++");
        restore.compareExact (cpprestore, "C loaded C++", "C loaded C");
        restore.compareExact (cpploadc, "C++ loaded C", "C loaded C");
        restore.compareExact (cpploadcpp, "C++ loaded C++", "C loaded C");
    }

    switch (comp)
    {
        case EXR_COMPRESSION_NONE:
        case EXR_COMPRESSION_RLE:
        case EXR_COMPRESSION_ZIP:
        case EXR_COMPRESSION_ZIPS:
            restore.compareExact (p, "orig", "C loaded C");
            break;
        case EXR_COMPRESSION_PIZ:
        case EXR_COMPRESSION_PXR24:
        case EXR_COMPRESSION_B44:
        case EXR_COMPRESSION_B44A:
        case EXR_COMPRESSION_DWAA:
        case EXR_COMPRESSION_DWAB:
            restore.compareClose (p, comp, "orig", "C loaded C");
            break;
        case EXR_COMPRESSION_LAST_TYPE:
        default:
            std::cerr << "Unknown compression type " << (int) (comp)
                      << std::endl;
            EXRCORE_TEST (false);
            break;
    }
    remove (filename.c_str ());
    remove (cppfilename.c_str ());
}